

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O2

void __thiscall draco::PointCloud::DeduplicatePointIds(PointCloud *this)

{
  __node_base _Var1;
  ulong uVar2;
  __hash_code _Var3;
  __node_ptr p_Var4;
  __node_ptr p_Var5;
  __buckets_ptr pp_Var6;
  __node_base_ptr p_Var7;
  _Hash_node_base *p_Var8;
  size_type sVar9;
  ulong uVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_dc;
  unordered_map<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:212:24),_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
  unique_point_map;
  _Scoped_node local_90;
  size_t local_80;
  PointCloud *local_78;
  ulong local_70;
  pair<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
  local_68;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
  index_map;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  unique_points;
  
  unique_point_map._M_h._M_buckets = &unique_point_map._M_h._M_single_bucket;
  unique_point_map._M_h._M_bucket_count = 1;
  unique_point_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  unique_point_map._M_h._M_element_count = 0;
  unique_point_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  unique_point_map._M_h._M_rehash_policy._M_next_resize = 0;
  unique_point_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  unique_point_map._M_h.
  super__Hashtable_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:212:24),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  .
  super__Hash_code_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
  .
  super__Hashtable_ebo_helper<1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_false>
  ._M_tp.this = (_Hashtable_ebo_helper<1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_false>
                 )(_Hashtable_ebo_helper<1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_false>
                   )this;
  unique_point_map._M_h.
  super__Hashtable_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:212:24),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  .
  super__Hashtable_ebo_helper<0,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:212:24),_false>
  ._M_tp.this = (key_equal)(key_equal)this;
  uVar2 = std::__detail::_Prime_rehash_policy::_M_next_bkt
                    ((ulong)&unique_point_map._M_h._M_rehash_policy);
  if (unique_point_map._M_h._M_bucket_count < uVar2) {
    unique_point_map._M_h._M_buckets =
         std::
         _Hashtable<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>,_std::__detail::_Select1st,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:212:24),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         ::_M_allocate_buckets(&unique_point_map._M_h,uVar2);
    unique_point_map._M_h._M_bucket_count = uVar2;
  }
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
  ::IndexTypeVector(&index_map,(ulong)this->num_points_);
  unique_points.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unique_points.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unique_points.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar11 = 0;
  uVar2 = 0;
  local_78 = this;
  do {
    local_dc.value_ = uVar11;
    if (this->num_points_ <= uVar11) {
      if ((uint)uVar2 != this->num_points_) {
        (*this->_vptr_PointCloud[6])(this,&index_map,&unique_points);
        this->num_points_ = (uint)uVar2;
      }
      std::
      _Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
      ::~_Vector_base(&unique_points.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                     );
      std::
      _Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
      ::~_Vector_base((_Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                       *)&index_map);
      std::
      _Hashtable<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>,_std::__detail::_Select1st,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:212:24),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&unique_point_map._M_h);
      return;
    }
    _Var3 = std::__detail::
            _Hash_code_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
            ::_M_hash_code((_Hash_code_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                            *)&unique_point_map._M_h,&local_dc);
    p_Var4 = std::
             _Hashtable<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>,_std::__detail::_Select1st,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:212:24),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_node(&unique_point_map._M_h,_Var3 % unique_point_map._M_h._M_bucket_count,
                            &local_dc,_Var3);
    if (p_Var4 == (__node_ptr)0x0) {
      local_68 = (pair<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
                  )((ulong)uVar11 | uVar2 << 0x20);
      local_90._M_h = (__hashtable_alloc *)&unique_point_map._M_h;
      local_70 = uVar2;
      p_Var5 = std::__detail::
               _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>const,draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>,true>>>
               ::
               _M_allocate_node<std::pair<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>>
                         ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>const,draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>,true>>>
                           *)&unique_point_map._M_h,&local_68);
      local_90._M_node = p_Var5;
      _Var3 = std::__detail::
              _Hash_code_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
              ::_M_hash_code((_Hash_code_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                              *)&unique_point_map._M_h,
                             (IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)
                             &p_Var5->
                              super__Hash_node_value<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_true>
                            );
      sVar9 = unique_point_map._M_h._M_bucket_count;
      uVar2 = _Var3 % unique_point_map._M_h._M_bucket_count;
      p_Var4 = std::
               _Hashtable<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>,_std::__detail::_Select1st,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:212:24),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::_M_find_node(&unique_point_map._M_h,uVar2,
                              (key_type *)
                              &p_Var5->
                               super__Hash_node_value<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_true>
                              ,_Var3);
      if (p_Var4 == (__node_ptr)0x0) {
        local_80 = unique_point_map._M_h._M_rehash_policy._M_next_resize;
        auVar12 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                            ((ulong)&unique_point_map._M_h._M_rehash_policy,sVar9,
                             unique_point_map._M_h._M_element_count);
        sVar9 = auVar12._8_8_;
        if ((auVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pp_Var6 = std::
                    _Hashtable<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>,_std::__detail::_Select1st,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:212:24),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::_M_allocate_buckets(&unique_point_map._M_h,sVar9);
          _Var1 = unique_point_map._M_h._M_before_begin;
          unique_point_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          uVar2 = 0;
LAB_0012fb03:
          uVar10 = uVar2;
          p_Var8 = _Var1._M_nxt;
          if (p_Var8 != (_Hash_node_base *)0x0) {
            _Var1._M_nxt = p_Var8->_M_nxt;
            uVar2 = (ulong)p_Var8[2]._M_nxt % sVar9;
            if (pp_Var6[uVar2] == (__node_base_ptr)0x0) break;
            p_Var8->_M_nxt = pp_Var6[uVar2]->_M_nxt;
            p_Var7 = pp_Var6[uVar2];
            uVar2 = uVar10;
            goto LAB_0012fb52;
          }
          std::
          _Hashtable<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>,_std::__detail::_Select1st,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:212:24),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_M_deallocate_buckets(&unique_point_map._M_h);
          uVar2 = _Var3 % sVar9;
          unique_point_map._M_h._M_buckets = pp_Var6;
          unique_point_map._M_h._M_bucket_count = sVar9;
        }
        (p_Var5->
        super__Hash_node_value<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_true>
        ).super__Hash_node_code_cache<true>._M_hash_code = _Var3;
        if (unique_point_map._M_h._M_buckets[uVar2] == (__node_base_ptr)0x0) {
          (p_Var5->super__Hash_node_base)._M_nxt = unique_point_map._M_h._M_before_begin._M_nxt;
          p_Var8 = (p_Var5->super__Hash_node_base)._M_nxt;
          if (p_Var8 != (_Hash_node_base *)0x0) {
            unique_point_map._M_h._M_buckets
            [(ulong)p_Var8[2]._M_nxt % unique_point_map._M_h._M_bucket_count] =
                 &p_Var5->super__Hash_node_base;
          }
          unique_point_map._M_h._M_buckets[uVar2] = &unique_point_map._M_h._M_before_begin;
          unique_point_map._M_h._M_before_begin._M_nxt = &p_Var5->super__Hash_node_base;
        }
        else {
          (p_Var5->super__Hash_node_base)._M_nxt = unique_point_map._M_h._M_buckets[uVar2]->_M_nxt;
          unique_point_map._M_h._M_buckets[uVar2]->_M_nxt = &p_Var5->super__Hash_node_base;
        }
        unique_point_map._M_h._M_element_count = unique_point_map._M_h._M_element_count + 1;
        local_90._M_node = (__node_ptr)0x0;
      }
      std::
      _Hashtable<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>,_std::__detail::_Select1st,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:212:24),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Scoped_node::~_Scoped_node(&local_90);
      uVar11 = (uint)local_70;
      index_map.vector_.
      super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[local_dc.value_].value_ = uVar11;
      std::
      vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
      ::push_back(&unique_points,&local_dc);
      uVar2 = (ulong)(uVar11 + 1);
      this = local_78;
    }
    else {
      index_map.vector_.
      super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar11].value_ =
           *(uint *)((long)&(p_Var4->
                            super__Hash_node_value<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                            ._M_storage._M_storage + 4);
    }
    uVar11 = local_dc.value_ + 1;
  } while( true );
  p_Var8->_M_nxt = unique_point_map._M_h._M_before_begin._M_nxt;
  pp_Var6[uVar2] = &unique_point_map._M_h._M_before_begin;
  unique_point_map._M_h._M_before_begin._M_nxt = p_Var8;
  if (p_Var8->_M_nxt != (_Hash_node_base *)0x0) {
    p_Var7 = (__node_base_ptr)(pp_Var6 + uVar10);
LAB_0012fb52:
    p_Var7->_M_nxt = p_Var8;
  }
  goto LAB_0012fb03;
}

Assistant:

void PointCloud::DeduplicatePointIds() {
  // Hashing function for a single vertex.
  auto point_hash = [this](PointIndex p) {
    PointIndex::ValueType hash = 0;
    for (int32_t i = 0; i < this->num_attributes(); ++i) {
      const AttributeValueIndex att_id = attribute(i)->mapped_index(p);
      hash = static_cast<uint32_t>(HashCombine(att_id.value(), hash));
    }
    return hash;
  };
  // Comparison function between two vertices.
  auto point_compare = [this](PointIndex p0, PointIndex p1) {
    for (int32_t i = 0; i < this->num_attributes(); ++i) {
      const AttributeValueIndex att_id0 = attribute(i)->mapped_index(p0);
      const AttributeValueIndex att_id1 = attribute(i)->mapped_index(p1);
      if (att_id0 != att_id1) {
        return false;
      }
    }
    return true;
  };

  std::unordered_map<PointIndex, PointIndex, decltype(point_hash),
                     decltype(point_compare)>
      unique_point_map(num_points_, point_hash, point_compare);
  int32_t num_unique_points = 0;
  IndexTypeVector<PointIndex, PointIndex> index_map(num_points_);
  std::vector<PointIndex> unique_points;
  // Go through all vertices and find their duplicates.
  for (PointIndex i(0); i < num_points_; ++i) {
    const auto it = unique_point_map.find(i);
    if (it != unique_point_map.end()) {
      index_map[i] = it->second;
    } else {
      unique_point_map.insert(std::make_pair(i, PointIndex(num_unique_points)));
      index_map[i] = num_unique_points++;
      unique_points.push_back(i);
    }
  }
  if (num_unique_points == num_points_) {
    return;  // All vertices are already unique.
  }

  ApplyPointIdDeduplication(index_map, unique_points);
  set_num_points(num_unique_points);
}